

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O3

double __thiscall
Gudhi::Persistence_representations::Persistence_landscape::compute_integral_of_landscape
          (Persistence_landscape *this)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  
  pvVar1 = (this->land).
           super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->land).
                super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar3 != 0) {
    dVar7 = 0.0;
    lVar4 = 0;
    do {
      lVar2 = *(long *)&pvVar1[lVar4].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl;
      lVar6 = (long)*(pointer *)
                     ((long)&pvVar1[lVar4].
                             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                             ._M_impl + 8) - lVar2 >> 4;
      if (lVar6 != 3) {
        lVar6 = lVar6 + -3;
        pdVar5 = (double *)(lVar2 + 0x28);
        do {
          dVar7 = dVar7 + (*pdVar5 + pdVar5[-2]) * (pdVar5[-1] - pdVar5[-3]) * 0.5;
          pdVar5 = pdVar5 + 2;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != (lVar3 >> 3) * -0x5555555555555555);
    return dVar7;
  }
  return 0.0;
}

Assistant:

double Persistence_landscape::compute_integral_of_landscape() const {
  double result = 0;
  for (size_t i = 0; i != this->land.size(); ++i) {
    for (size_t nr = 2; nr != this->land[i].size() - 1; ++nr) {
      // it suffices to compute every planar integral and then sum them up for each lambda_n
      result += 0.5 * (this->land[i][nr].first - this->land[i][nr - 1].first) *
                (this->land[i][nr].second + this->land[i][nr - 1].second);
    }
  }
  return result;
}